

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run(void)

{
  bool bVar1;
  FILE *__stream;
  char *pcVar2;
  int *piVar3;
  undefined8 extraout_RAX;
  FILE *this;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FlagSaver fs;
  string filename;
  FlagSaver local_2060;
  string local_2058;
  undefined1 local_2038 [8191];
  undefined1 local_39;
  
  FlagSaver::FlagSaver(&local_2060);
  fprintf(_stderr,"Running test %s/%s\n","DeprecatedFunctionsTest","AppendFlagsIntoFile");
  fLI::FLAGS_test_int32 = 10;
  local_2038._16_8_ = 0x656c696667616c66;
  local_2038._8_8_ = (char *)0x8;
  local_2038[0x18] = '\0';
  local_2038._0_8_ = local_2038 + 0x10;
  TmpFile(&local_2058,(string *)local_2038);
  if ((undefined1 *)local_2038._0_8_ != local_2038 + 0x10) {
    operator_delete((void *)local_2038._0_8_);
  }
  unlink(local_2058._M_dataplus._M_p);
  bVar1 = AppendFlagsIntoFile(&local_2058,"not the real argv0");
  if (bVar1) {
    __stream = fopen(local_2058._M_dataplus._M_p,"r");
    if (__stream == (FILE *)0x0) goto LAB_0013964a;
    this = (FILE *)local_2038;
    pcVar2 = fgets((char *)this,0x1fff,__stream);
    if (pcVar2 == (char *)0x0) goto LAB_0013965c;
    auVar7[0] = -((char)local_2038._16_8_ == 'v');
    auVar7[1] = -(SUB81(local_2038._16_8_,1) == '0');
    auVar7[2] = -(SUB81(local_2038._16_8_,2) == '\n');
    auVar7[3] = -(SUB81(local_2038._16_8_,3) == '\0');
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar5[0] = -(local_2038[0] == 'n');
    auVar5[1] = -(local_2038[1] == 'o');
    auVar5[2] = -(local_2038[2] == 't');
    auVar5[3] = -(local_2038[3] == ' ');
    auVar5[4] = -(local_2038[4] == 't');
    auVar5[5] = -(local_2038[5] == 'h');
    auVar5[6] = -(local_2038[6] == 'e');
    auVar5[7] = -(local_2038[7] == ' ');
    auVar5[8] = -(local_2038[8] == 'r');
    auVar5[9] = -(local_2038[9] == 'e');
    auVar5[10] = -(local_2038[10] == 'a');
    auVar5[0xb] = -(local_2038[0xb] == 'l');
    auVar5[0xc] = -(local_2038[0xc] == ' ');
    auVar5[0xd] = -(local_2038[0xd] == 'a');
    auVar5[0xe] = -(local_2038[0xe] == 'r');
    auVar5[0xf] = -(local_2038[0xf] == 'g');
    auVar5 = auVar5 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00139661;
    this = (FILE *)local_2038;
    pcVar2 = fgets((char *)this,0x1fff,__stream);
    if (pcVar2 == (char *)0x0) {
      bVar4 = false;
      bVar1 = false;
    }
    else {
      bVar1 = false;
      bVar4 = false;
      do {
        local_39 = 0;
        auVar6[0] = -(local_2038[3] == 'e');
        auVar6[1] = -(local_2038[4] == 's');
        auVar6[2] = -(local_2038[5] == 't');
        auVar6[3] = -(local_2038[6] == '_');
        auVar6[4] = -(local_2038[7] == 'b');
        auVar6[5] = -(local_2038[8] == 'o');
        auVar6[6] = -(local_2038[9] == 'o');
        auVar6[7] = -(local_2038[10] == 'l');
        auVar6[8] = -(local_2038[0xb] == '=');
        auVar6[9] = -(local_2038[0xc] == 'f');
        auVar6[10] = -(local_2038[0xd] == 'a');
        auVar6[0xb] = -(local_2038[0xe] == 'l');
        auVar6[0xc] = -(local_2038[0xf] == 's');
        auVar6[0xd] = -(local_2038[0x10] == 'e');
        auVar6[0xe] = -(local_2038[0x11] == '\n');
        auVar6[0xf] = -(local_2038[0x12] == '\0');
        auVar8[0] = -(local_2038[0] == '-');
        auVar8[1] = -(local_2038[1] == '-');
        auVar8[2] = -(local_2038[2] == 't');
        auVar8[3] = -(local_2038[3] == 'e');
        auVar8[4] = -(local_2038[4] == 's');
        auVar8[5] = -(local_2038[5] == 't');
        auVar8[6] = -(local_2038[6] == '_');
        auVar8[7] = -(local_2038[7] == 'b');
        auVar8[8] = -(local_2038[8] == 'o');
        auVar8[9] = -(local_2038[9] == 'o');
        auVar8[10] = -(local_2038[10] == 'l');
        auVar8[0xb] = -(local_2038[0xb] == '=');
        auVar8[0xc] = -(local_2038[0xc] == 'f');
        auVar8[0xd] = -(local_2038[0xd] == 'a');
        auVar8[0xe] = -(local_2038[0xe] == 'l');
        auVar8[0xf] = -(local_2038[0xf] == 's');
        auVar8 = auVar8 & auVar6;
        if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
          bVar4 = true;
        }
        if ((local_2038[0x10] == '\0' && (pointer)local_2038._0_8_ == (pointer)0x695f747365742d2d)
            && (char *)local_2038._8_8_ == (char *)0xa30313d3233746e) {
          bVar1 = true;
        }
        this = (FILE *)local_2038;
        pcVar2 = fgets((char *)local_2038,0x1fff,__stream);
      } while (pcVar2 != (char *)0x0);
    }
    if (!bVar1) goto LAB_00139666;
    if (bVar4) {
      fclose(__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2058._M_dataplus._M_p != &local_2058.field_2) {
        operator_delete(local_2058._M_dataplus._M_p);
      }
      FlagSaver::~FlagSaver(&local_2060);
      return;
    }
  }
  else {
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_0013964a:
    piVar3 = __errno_location();
    this = _stderr;
    if (*piVar3 != 0) goto LAB_00139670;
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run
              ((Test_DeprecatedFunctionsTest_AppendFlagsIntoFile *)_stderr);
LAB_0013965c:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_00139661:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_00139666:
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
  }
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run();
LAB_00139670:
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_AppendFlagsIntoFile::Run
            ((Test_DeprecatedFunctionsTest_AppendFlagsIntoFile *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2058._M_dataplus._M_p != &local_2058.field_2) {
    operator_delete(local_2058._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&local_2060);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(DeprecatedFunctionsTest, AppendFlagsIntoFile) {
  FLAGS_test_int32 = 10;     // just to make the test more interesting
  string filename(TmpFile("flagfile"));
  unlink(filename.c_str());  // just to be safe
  const bool r = AppendFlagsIntoFile(filename, "not the real argv0");
  EXPECT_TRUE(r);

  FILE* fp;
  EXPECT_EQ(0, SafeFOpen(&fp, filename.c_str(), "r"));
  EXPECT_TRUE(fp != NULL);
  char line[8192];
  EXPECT_TRUE(fgets(line, sizeof(line)-1, fp) != NULL);  // get the first line
  // First line should be progname.
  EXPECT_STREQ("not the real argv0\n", line);

  bool found_bool = false, found_int32 = false;
  while (fgets(line, sizeof(line)-1, fp)) {
    line[sizeof(line)-1] = '\0';    // just to be safe
    if (strcmp(line, "--test_bool=false\n") == 0)
      found_bool = true;
    if (strcmp(line, "--test_int32=10\n") == 0)
      found_int32 = true;
  }
  EXPECT_TRUE(found_int32);
  EXPECT_TRUE(found_bool);
  fclose(fp);
}